

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf262.c
# Opt level: O3

void ymf262_reset_chip(void *chip)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  
  *(undefined8 *)((long)chip + 0x12c0) = 0;
  *(undefined4 *)((long)chip + 0x22ec) = 1;
  *(undefined1 *)((long)chip + 0x230e) = 0;
  bVar1 = *(byte *)((long)chip + 0x230c) & 0x9f;
  *(byte *)((long)chip + 0x230c) = bVar1;
  if (bVar1 == 0x80) {
    *(undefined1 *)((long)chip + 0x230c) = 0;
    if (*(code **)((long)chip + 0x2320) != (code *)0x0) {
      (**(code **)((long)chip + 0x2320))(*(undefined8 *)((long)chip + 9000),0);
    }
  }
  *(undefined8 *)((long)chip + 0x22fc) = 0x100000000400;
  OPL3WriteReg((OPL3 *)chip,4,0);
  uVar3 = 0x100;
  do {
    uVar3 = uVar3 - 1;
    OPL3WriteReg((OPL3 *)chip,uVar3,0);
  } while (0x20 < uVar3);
  uVar3 = 0x200;
  do {
    uVar3 = uVar3 - 1;
    OPL3WriteReg((OPL3 *)chip,uVar3,0);
  } while (0x120 < uVar3);
  lVar2 = 0xcc;
  do {
    *(undefined1 *)((long)chip + lVar2 + -0x7a) = 0;
    *(undefined4 *)((long)chip + lVar2 + -0x70) = 0x1ff;
    *(undefined1 *)((long)chip + lVar2 + -10) = 0;
    *(undefined4 *)((long)chip + lVar2) = 0x1ff;
    lVar2 = lVar2 + 0xf0;
  } while (lVar2 != 0x11ac);
  *(undefined1 *)((long)chip + 0x2340) = 1;
  return;
}

Assistant:

void ymf262_reset_chip(void *chip)
{
	OPL3ResetChip((OPL3 *)chip);
}